

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O2

int bio_byteout(opj_bio_t *bio)

{
  uint uVar1;
  uchar *puVar2;
  uint uVar3;
  
  uVar1 = bio->buf;
  uVar3 = uVar1 & 0xff;
  bio->buf = uVar3 << 8;
  bio->ct = (uVar3 != 0xff) + 7;
  puVar2 = bio->bp;
  if (puVar2 < bio->end) {
    bio->bp = puVar2 + 1;
    *puVar2 = (uchar)uVar1;
    return 0;
  }
  return 1;
}

Assistant:

static int bio_byteout(opj_bio_t *bio) {
	bio->buf = (bio->buf << 8) & 0xffff;
	bio->ct = bio->buf == 0xff00 ? 7 : 8;
	if (bio->bp >= bio->end) {
		return 1;
	}
	*bio->bp++ = bio->buf >> 8;
	return 0;
}